

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launch_fixed.cpp
# Opt level: O0

void authenticate_and_launch(void)

{
  _Setw _Var1;
  int iVar2;
  istream *__in;
  size_t max;
  char response [8];
  bool allowaccess;
  int n_missiles;
  
  response[1] = '\x02';
  response[2] = '\0';
  response[3] = '\0';
  response[4] = '\0';
  response[0] = '\0';
  printf("Secret: ");
  _Var1 = std::setw(8);
  __in = std::operator>>((istream *)&std::cin,_Var1);
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)__in,
                  (char (*) [8])((long)&max + 3));
  iVar2 = strcmp((char *)((long)&max + 3),"Joshua");
  if (iVar2 == 0) {
    response[0] = '\x01';
  }
  if ((response[0] & 1U) != 0) {
    puts("Access granted");
    launch_missiles(response._1_4_);
  }
  if ((response[0] & 1U) == 0) {
    puts("Access denied");
  }
  return;
}

Assistant:

void authenticate_and_launch() {
  int n_missiles = 2;
  bool allowaccess = false;
  char response[8];

  printf("Secret: ");
  size_t max = sizeof response;
  std::cin >> std::setw(max) >> response;

  if (strcmp(response, "Joshua") == 0)
    allowaccess = true;

  if (allowaccess) {
    puts("Access granted");
    launch_missiles(n_missiles);
  }

  if (!allowaccess)
    puts("Access denied");
}